

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testInit
          (SSBLayoutQualifierConflictTest *this)

{
  bool bVar1;
  value_type local_2c;
  testCase test_case;
  GLuint stage_1;
  GLuint qualifier;
  GLuint stage;
  SSBLayoutQualifierConflictTest *pSStack_10;
  bool stage_support [6];
  SSBLayoutQualifierConflictTest *this_local;
  
  pSStack_10 = this;
  for (stage_1 = 0; stage_1 < 6; stage_1 = stage_1 + 1) {
    bVar1 = isStageSupported(this,stage_1);
    *(bool *)((long)&qualifier + (ulong)stage_1 + 2) = bVar1;
  }
  for (test_case.m_stage = COMPUTE; test_case.m_stage < FRAGMENT;
      test_case.m_stage = test_case.m_stage + VERTEX) {
    for (test_case.m_qualifier = DEFAULT; test_case.m_qualifier < (PACKED|STD430);
        test_case.m_qualifier = test_case.m_qualifier + STD140) {
      if ((*(byte *)((long)&qualifier + (ulong)test_case.m_qualifier + 2) & 1) != 0) {
        local_2c.m_qualifier = test_case.m_stage;
        local_2c.m_stage = test_case.m_qualifier;
        std::
        vector<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::SSBLayoutQualifierConflictTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_2c);
      }
    }
  }
  return;
}

Assistant:

void SSBLayoutQualifierConflictTest::testInit()
{
	bool stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (false == stage_support[stage])
			{
				continue;
			}

			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}